

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int archive_read_format_7zip_read_header(archive_read *a,archive_entry *entry)

{
  uint32_t **ppuVar1;
  size_t *psVar2;
  _7z_folder *p_Var3;
  long lVar4;
  void *pvVar5;
  uint64_t uVar6;
  size_t sVar7;
  wchar_t wVar8;
  uint uVar9;
  int iVar10;
  uint32_t *puVar11;
  archive_string_conv *paVar12;
  int *piVar13;
  char *pcVar14;
  undefined8 *__ptr;
  undefined8 *puVar15;
  char *pcVar16;
  ulong uVar17;
  int64_t iVar18;
  uchar *puVar19;
  long lVar20;
  uint64_t *puVar21;
  size_t sVar22;
  _7z_stream_info *si;
  char *pcVar23;
  ulong uVar24;
  bool bVar25;
  size_t size;
  int64_t offset;
  _7z_header_info header;
  archive_format_descriptor *local_98;
  size_t local_88;
  ulong local_80;
  long local_78;
  _7z_stream_info *local_70;
  _7z_header_info local_68;
  long local_38;
  
  local_98 = a->format;
  si = (_7z_stream_info *)local_98->data;
  if ((int)si[0xc6].ss.unpack_streams == -1) {
    *(undefined4 *)&si[0xc6].ss.unpack_streams = 0;
  }
  (a->archive).archive_format = 0xe0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    local_98 = (archive_format_descriptor *)0x2cd0b6;
    (a->archive).archive_format_name = "7-Zip";
  }
  if (si[1].ci.folders == (_7z_folder *)0x0) {
    local_68.emptyFileBools = (uchar *)0x0;
    local_68.antiBools = (uchar *)0x0;
    local_68.dataIndex = 0;
    local_68.emptyStreamBools = (uchar *)0x0;
    local_68.attrBools = (uchar *)0x0;
    piVar13 = (int *)__archive_read_ahead(a,0x20,&local_78);
    if (piVar13 == (int *)0x0) {
LAB_0023221a:
      local_98 = (archive_format_descriptor *)0xffffffe2;
    }
    else {
      if ((((char)*piVar13 != 'M') || (*(char *)((long)piVar13 + 1) != 'Z')) &&
         (*piVar13 != 0x464c457f)) {
LAB_00232142:
        ppuVar1 = &si[1].pi.digest.digests;
        *ppuVar1 = *ppuVar1 + 8;
        if ((short)piVar13[1] == 0x1c27 && *piVar13 == -0x504385c9) {
          uVar24 = crc32(0,piVar13 + 3,0x14);
          if (uVar24 == (uint)piVar13[2]) {
            uVar6 = *(uint64_t *)(piVar13 + 5);
            if (uVar6 == 0) {
              local_98 = (archive_format_descriptor *)0x1;
              goto LAB_0023221f;
            }
            if ((long)((ulong)(uint)piVar13[4] << 0x20) < 0) {
              pcVar14 = "Malformed 7-Zip archive";
              goto LAB_0023220b;
            }
            puVar21 = (uint64_t *)CONCAT44(piVar13[4],piVar13[3]);
            uVar9 = piVar13[7];
            __archive_read_consume(a,0x20);
            if (puVar21 == (uint64_t *)0x0) {
LAB_00232318:
              si[2].pi.positions = puVar21;
              si[1].pi.digest.defineds = (uchar *)puVar21;
              si[1].pi.numPackStreams = uVar6;
              si[1].pi.sizes = (uint64_t *)0x0;
              si[1].pi.pos = 1;
              *(undefined4 *)&si[0xc6].ss.unpack_streams = 0;
              puVar19 = header_bytes(a,1);
              if (puVar19 != (uchar *)0x0) {
                if (*puVar19 == '\x01') {
                  bVar25 = false;
                }
                else {
                  if (*puVar19 != '\x17') {
                    archive_set_error(&a->archive,-1,"Unexpected Property ID = %X");
                    goto LAB_0023221a;
                  }
                  iVar10 = decode_encoded_header_info(a,si);
                  if ((iVar10 == 0) && (iVar10 = 0, si[1].pi.sizes != (uint64_t *)(ulong)uVar9)) {
                    iVar10 = -1;
                    archive_set_error(&a->archive,-1,"Damaged 7-Zip archive");
                  }
                  bVar25 = true;
                  if (iVar10 == 0) {
                    p_Var3 = (si->ci).folders;
                    bVar25 = p_Var3->digest_defined != '\0';
                    if (bVar25) {
                      uVar9 = p_Var3->digest;
                    }
                    if (si[2].ss.unpackSizes != (uint64_t *)0x0) {
                      read_consume(a);
                    }
                    iVar10 = setup_decode_folder(a,(si->ci).folders,1);
                    if (iVar10 == 0) {
                      si[1].pi.numPackStreams = (uint64_t)si[2].ci.folders;
                      iVar10 = seek_pack(a);
                    }
                  }
                  free_StreamsInfo(si);
                  (si->ss).unpackSizes = (uint64_t *)0x0;
                  (si->ss).digestsDefined = (uchar *)0x0;
                  (si->ci).dataStreamIndex = 0;
                  (si->ss).unpack_streams = 0;
                  (si->ci).numFolders = 0;
                  (si->ci).folders = (_7z_folder *)0x0;
                  (si->pi).digest.digests = (uint32_t *)0x0;
                  (si->pi).positions = (uint64_t *)0x0;
                  (si->pi).sizes = (uint64_t *)0x0;
                  (si->pi).digest.defineds = (uchar *)0x0;
                  (si->pi).pos = 0;
                  (si->pi).numPackStreams = 0;
                  (si->ss).digests = (uint32_t *)0x0;
                  if (iVar10 < 0) {
                    local_98 = (archive_format_descriptor *)0xffffffe2;
                    goto LAB_0023221f;
                  }
                  *(undefined4 *)((long)&si[1].pi.pos + 4) = 1;
                  si[1].pi.sizes = (uint64_t *)0x0;
                  bVar25 = !bVar25;
                }
                piVar13 = __errno_location();
                *piVar13 = 0;
                iVar10 = read_Header(a,&local_68,*(int *)((long)&si[1].pi.pos + 4));
                if (iVar10 < 0) {
                  if (*piVar13 == 0xc) {
                    pcVar14 = "Couldn\'t allocate memory";
                  }
                  else {
                    pcVar14 = "Damaged 7-Zip archive";
                  }
                }
                else {
                  puVar19 = header_bytes(a,1);
                  if (((puVar19 != (uchar *)0x0) && (*puVar19 == '\0')) &&
                     ((bVar25 || (si[1].pi.sizes == (uint64_t *)(ulong)uVar9)))) {
                    local_98 = (archive_format_descriptor *)0x0;
                    si[2].pi.digest.digests = (uint32_t *)0x0;
                    si[2].ss.unpackSizes = (uint64_t *)0x0;
                    *(undefined4 *)&si[1].pi.pos = 0;
                    si[2].ci.folders = (_7z_folder *)0x0;
                    si[2].ci.dataStreamIndex = 0;
                    goto LAB_0023221f;
                  }
                  pcVar14 = "Malformed 7-Zip archive";
                }
                goto LAB_0023220b;
              }
              archive_set_error(&a->archive,0x54,"Truncated 7-Zip file body");
            }
            else {
              if ((long)puVar21 <= local_78) {
                __archive_read_consume(a,(int64_t)puVar21);
                goto LAB_00232318;
              }
              iVar18 = __archive_read_seek(a,(long)si[1].pi.digest.digests + (long)puVar21,0);
              if (-1 < iVar18) goto LAB_00232318;
            }
            local_98 = (archive_format_descriptor *)0xffffffe2;
            goto LAB_0023221f;
          }
          pcVar14 = "Header CRC error";
        }
        else {
          pcVar14 = "Not 7-Zip archive file";
        }
LAB_0023220b:
        archive_set_error(&a->archive,-1,pcVar14);
        goto LAB_0023221a;
      }
      if (local_78 < 0x27001) {
        iVar18 = __archive_read_seek(a,0x27000,0);
        if (-1 < iVar18) goto LAB_00231f39;
        local_98 = (archive_format_descriptor *)0xffffffe2;
        bVar25 = true;
      }
      else {
        __archive_read_consume(a,0x27000);
LAB_00231f39:
        lVar20 = 0;
        uVar24 = 1;
        local_70 = si;
        do {
          while (pcVar14 = (char *)__archive_read_ahead(a,uVar24,(ssize_t *)&local_88),
                pcVar14 == (char *)0x0) {
            if (uVar24 < 0x80) goto LAB_00232065;
            uVar17 = uVar24 >> 1;
LAB_0023200a:
            uVar24 = uVar17;
            if (0x39000 < uVar17 + lVar20) goto LAB_00232065;
          }
          uVar17 = 0x1000;
          if ((long)local_88 < 6) goto LAB_0023200a;
          pcVar23 = pcVar14 + local_88;
          local_80 = lVar20 + 0x27000;
          local_38 = lVar20;
          for (pcVar16 = pcVar14; pcVar16 + 0x20 < pcVar23; pcVar16 = pcVar16 + uVar9) {
            uVar9 = check_7zip_header_in_sfx(pcVar16);
            if (uVar9 == 0) {
              pvVar5 = a->format->data;
              __archive_read_consume(a,(long)pcVar16 - (long)pcVar14);
              *(ulong *)((long)pvVar5 + 0x88) = ((long)pcVar16 - (long)pcVar14) + local_80;
              bVar25 = false;
              local_98 = (archive_format_descriptor *)0x0;
              si = local_70;
              goto LAB_0023211c;
            }
          }
          __archive_read_consume(a,(long)pcVar16 - (long)pcVar14);
          lVar20 = local_38 + ((long)pcVar16 - (long)pcVar14);
          if (uVar24 == 1) {
            uVar24 = 0x1000;
          }
        } while (lVar20 + uVar24 < 0x39001);
LAB_00232065:
        archive_set_error(&a->archive,0x54,"Couldn\'t find out 7-Zip header");
        local_98 = (archive_format_descriptor *)0xffffffe2;
        bVar25 = true;
        si = local_70;
      }
LAB_0023211c:
      if (!bVar25) {
        piVar13 = (int *)__archive_read_ahead(a,0x20,&local_78);
        if (piVar13 == (int *)0x0) goto LAB_0023221a;
        goto LAB_00232142;
      }
    }
LAB_0023221f:
    free(local_68.emptyStreamBools);
    free(local_68.emptyFileBools);
    free(local_68.antiBools);
    free(local_68.attrBools);
    if ((int)local_98 != 0) {
      return (int)local_98;
    }
    p_Var3 = si[1].ci.folders;
    si[1].pi.positions = (uint64_t *)si[1].ci.numFolders;
    si[1].ci.dataStreamIndex = (uint64_t)p_Var3;
  }
  else {
    puVar21 = &si[1].ci.dataStreamIndex;
    *puVar21 = *puVar21 + 0x50;
  }
  puVar21 = si[1].pi.positions;
  psVar2 = (size_t *)si[1].ci.dataStreamIndex;
  if (psVar2 == (size_t *)0x0 || puVar21 == (uint64_t *)0x0) {
    return 1;
  }
  si[1].pi.positions = (uint64_t *)((long)puVar21 + -1);
  si[1].ss.unpackSizes = (uint64_t *)0x0;
  *(undefined1 *)&si[2].pi.pos = 0;
  puVar11 = (uint32_t *)crc32(0,0,0);
  si[1].ss.digests = puVar11;
  if (si[0xc6].pi.pos == 0) {
    paVar12 = archive_string_conversion_from_charset((archive_conflict *)a,"UTF-16LE",L'\x01');
    si[0xc6].pi.pos = (uint64_t)paVar12;
    if (paVar12 != (archive_string_conv *)0x0) goto LAB_00231bc6;
LAB_00231c98:
    local_80._0_4_ = -0x1e;
  }
  else {
LAB_00231bc6:
    sVar22 = psVar2[2];
    if (((ulong)(uint)sVar22 < (si->ci).numFolders) &&
       (p_Var3 = (si->ci).folders, p_Var3 != (_7z_folder *)0x0)) {
      uVar24 = 0xffffffffffffffff;
      lVar20 = 0;
      do {
        uVar24 = uVar24 + 1;
        if (p_Var3[(uint)sVar22].numCoders <= uVar24) break;
        lVar4 = *(long *)((long)&(p_Var3[(uint)sVar22].coders)->codec + lVar20);
        if (((lVar4 == 0x6f10101) || (lVar4 == 0x6f10701)) || (lVar4 == 0x6f10303)) {
          archive_entry_set_is_data_encrypted(entry,'\x01');
          *(undefined4 *)&si[0xc6].ss.unpack_streams = 1;
        }
        lVar20 = lVar20 + 0x28;
      } while (p_Var3 != (_7z_folder *)0x0);
    }
    if ((int)si[0xc6].ss.unpack_streams == -1) {
      *(undefined4 *)&si[0xc6].ss.unpack_streams = 0;
    }
    wVar8 = _archive_entry_copy_pathname_l
                      (entry,(char *)psVar2[1],*psVar2,(archive_string_conv *)si[0xc6].pi.pos);
    if (wVar8 == L'\0') {
      local_80 = local_80 & 0xffffffff00000000;
    }
    else {
      piVar13 = __errno_location();
      if (*piVar13 == 0xc) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
        goto LAB_00231c98;
      }
      pcVar14 = archive_string_conversion_charset_name((archive_string_conv *)si[0xc6].pi.pos);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                        pcVar14);
      local_80 = CONCAT44(local_80._4_4_,0xffffffec);
    }
    archive_entry_set_mode(entry,*(mode_t *)((long)psVar2 + 0x44));
    if ((psVar2[3] & 1) != 0) {
      archive_entry_set_mtime(entry,psVar2[4],(ulong)(uint)psVar2[7]);
    }
    if ((psVar2[3] & 4) != 0) {
      archive_entry_set_ctime(entry,psVar2[6],(ulong)(uint)psVar2[8]);
    }
    if ((psVar2[3] & 2) != 0) {
      archive_entry_set_atime(entry,psVar2[5],(ulong)*(uint *)((long)psVar2 + 0x3c));
    }
    if ((ulong)*(uint *)((long)psVar2 + 0x14) == 0xffffffff) {
      puVar19 = (uchar *)0x0;
    }
    else {
      puVar19 = (uchar *)(si->ss).unpackSizes[*(uint *)((long)psVar2 + 0x14)];
    }
    si[1].ss.digestsDefined = puVar19;
    archive_entry_set_size(entry,(la_int64_t)puVar19);
    sVar22 = psVar2[9];
    if (((sVar22 & 7) != 0) && (__ptr = (undefined8 *)malloc(0x16), __ptr != (undefined8 *)0x0)) {
      puVar15 = __ptr;
      if ((sVar22 & 1) != 0) {
        *__ptr = 0x796c6e6f64722c;
        puVar15 = (undefined8 *)((long)__ptr + 7);
      }
      if ((psVar2[9] & 2) != 0) {
        *puVar15 = 0x6e65646469682c;
        puVar15 = (undefined8 *)((long)puVar15 + 7);
      }
      if ((psVar2[9] & 4) != 0) {
        *puVar15 = 0x6d65747379732c;
        puVar15 = (undefined8 *)((long)puVar15 + 7);
      }
      if (__ptr < puVar15) {
        archive_entry_copy_fflags_text(entry,(char *)((long)__ptr + 1));
      }
      free(__ptr);
    }
    if (si[1].ss.digestsDefined == (uchar *)0x0) {
      *(undefined1 *)&si[2].pi.pos = 1;
    }
    if ((*(uint *)((long)psVar2 + 0x44) & 0xf000) == 0xa000) {
      sVar22 = 0;
      pcVar14 = (char *)0x0;
      do {
        if (si[1].ss.digestsDefined == (uchar *)0x0) {
          if (sVar22 == 0) {
            uVar9 = *(uint *)((long)psVar2 + 0x44) & 0xffff0fff | 0x8000;
            *(uint *)((long)psVar2 + 0x44) = uVar9;
            archive_entry_set_mode(entry,uVar9);
          }
          else {
            pcVar14[sVar22] = '\0';
            paVar12 = archive_string_conversion_from_charset((archive_conflict *)a,"UTF-8",L'\x01');
            if (paVar12 == (archive_string_conv *)0x0) {
              free(pcVar14);
              iVar10 = -0x1e;
              bVar25 = false;
              goto LAB_002322aa;
            }
            _archive_entry_copy_symlink_l(entry,pcVar14,sVar22,paVar12);
          }
          iVar10 = (int)local_98;
          free(pcVar14);
          archive_entry_set_size(entry,0);
          bVar25 = true;
          goto LAB_002322aa;
        }
        uVar9 = archive_read_format_7zip_read_data(a,(void **)&local_68,&local_88,&local_78);
        if ((int)uVar9 < -0x14) {
          free(pcVar14);
          local_98 = (archive_format_descriptor *)(ulong)uVar9;
LAB_00231f05:
          bVar25 = false;
          pcVar16 = pcVar14;
        }
        else {
          pcVar16 = (char *)realloc(pcVar14,local_88 + sVar22 + 1);
          sVar7 = local_88;
          if (pcVar16 == (char *)0x0) {
            free(pcVar14);
            archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Symname");
            local_98 = (archive_format_descriptor *)0xffffffe2;
            goto LAB_00231f05;
          }
          memcpy(pcVar16 + sVar22,(void *)local_68.dataIndex,local_88);
          sVar22 = sVar22 + sVar7;
          bVar25 = true;
        }
        pcVar14 = pcVar16;
      } while (bVar25);
      bVar25 = false;
      iVar10 = (int)local_98;
LAB_002322aa:
      if (!bVar25) {
        return iVar10;
      }
    }
    *(undefined2 *)((long)&si[0xc6].pi.numPackStreams + 4) = 0x70;
    *(undefined4 *)&si[0xc6].pi.numPackStreams = 0x695a2d37;
    (a->archive).archive_format_name = (char *)&si[0xc6].pi.numPackStreams;
  }
  return (int)local_80;
}

Assistant:

static int
archive_read_format_7zip_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	struct _7zip_entry *zip_entry;
	int r, ret = ARCHIVE_OK;
	struct _7z_folder *folder = 0;
	uint64_t fidx = 0;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "7-Zip";

	if (zip->entries == NULL) {
		struct _7z_header_info header;

		memset(&header, 0, sizeof(header));
		r = slurp_central_directory(a, zip, &header);
		free_Header(&header);
		if (r != ARCHIVE_OK)
			return (r);
		zip->entries_remaining = (size_t)zip->numFiles;
		zip->entry = zip->entries;
	} else {
		++zip->entry;
	}
	zip_entry = zip->entry;

	if (zip->entries_remaining <= 0 || zip_entry == NULL)
		return ARCHIVE_EOF;
	--zip->entries_remaining;

	zip->entry_offset = 0;
	zip->end_of_entry = 0;
	zip->entry_crc32 = crc32(0, NULL, 0);

	/* Setup a string conversion for a filename. */
	if (zip->sconv == NULL) {
		zip->sconv = archive_string_conversion_from_charset(
		    &a->archive, "UTF-16LE", 1);
		if (zip->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	/* Figure out if the entry is encrypted by looking at the folder
	   that is associated to the current 7zip entry. If the folder
	   has a coder with a _7Z_CRYPTO codec then the folder is encrypted.
	   Hence the entry must also be encrypted. */
	if (zip_entry && zip_entry->folderIndex < zip->si.ci.numFolders) {
		folder = &(zip->si.ci.folders[zip_entry->folderIndex]);
		for (fidx=0; folder && fidx<folder->numCoders; fidx++) {
			switch(folder->coders[fidx].codec) {
				case _7Z_CRYPTO_MAIN_ZIP:
				case _7Z_CRYPTO_RAR_29:
				case _7Z_CRYPTO_AES_256_SHA_256: {
					archive_entry_set_is_data_encrypted(entry, 1);
					zip->has_encrypted_entries = 1;
					break;
				}
			}
		}
	}

	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (archive_entry_copy_pathname_l(entry,
	    (const char *)zip_entry->utf16name,
	    zip_entry->name_len, zip->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(zip->sconv));
		ret = ARCHIVE_WARN;
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	if (zip_entry->flg & MTIME_IS_SET)
		archive_entry_set_mtime(entry, zip_entry->mtime,
			zip_entry->mtime_ns);
	if (zip_entry->flg & CTIME_IS_SET)
		archive_entry_set_ctime(entry, zip_entry->ctime,
		    zip_entry->ctime_ns);
	if (zip_entry->flg & ATIME_IS_SET)
		archive_entry_set_atime(entry, zip_entry->atime,
		    zip_entry->atime_ns);
	if (zip_entry->ssIndex != (uint32_t)-1) {
		zip->entry_bytes_remaining =
		    zip->si.ss.unpackSizes[zip_entry->ssIndex];
		archive_entry_set_size(entry, zip->entry_bytes_remaining);
	} else {
		zip->entry_bytes_remaining = 0;
		archive_entry_set_size(entry, 0);
	}

	// These attributes are supported by the windows implementation of archive_write_disk.
	const int supported_attrs = FILE_ATTRIBUTE_READONLY | FILE_ATTRIBUTE_HIDDEN | FILE_ATTRIBUTE_SYSTEM;

	if (zip_entry->attr & supported_attrs) {
		char *fflags_text, *ptr;
		/* allocate for ",rdonly,hidden,system" */
		fflags_text = malloc(22 * sizeof(*fflags_text));
		if (fflags_text != NULL) {
			ptr = fflags_text;
			if (zip_entry->attr & FILE_ATTRIBUTE_READONLY) {
				strcpy(ptr, ",rdonly");
				ptr = ptr + 7;
			}
			if (zip_entry->attr & FILE_ATTRIBUTE_HIDDEN) {
				strcpy(ptr, ",hidden");
				ptr = ptr + 7;
			}
			if (zip_entry->attr & FILE_ATTRIBUTE_SYSTEM) {
				strcpy(ptr, ",system");
				ptr = ptr + 7;
			}
			if (ptr > fflags_text) {
				archive_entry_copy_fflags_text(entry,
				    fflags_text + 1);
			}
			free(fflags_text);
		}
	}

	/* If there's no body, force read_data() to return EOF immediately. */
	if (zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	if ((zip_entry->mode & AE_IFMT) == AE_IFLNK) {
		unsigned char *symname = NULL;
		size_t symsize = 0;

		/*
		 * Symbolic-name is recorded as its contents. We have to
		 * read the contents at this time.
		 */
		while (zip->entry_bytes_remaining > 0) {
			const void *buff;
			unsigned char *mem;
			size_t size;
			int64_t offset;

			r = archive_read_format_7zip_read_data(a, &buff,
				&size, &offset);
			if (r < ARCHIVE_WARN) {
				free(symname);
				return (r);
			}
			mem = realloc(symname, symsize + size + 1);
			if (mem == NULL) {
				free(symname);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symname");
				return (ARCHIVE_FATAL);
			}
			symname = mem;
			memcpy(symname+symsize, buff, size);
			symsize += size;
		}
		if (symsize == 0) {
			/* If there is no symname, handle it as a regular
			 * file. */
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFREG;
			archive_entry_set_mode(entry, zip_entry->mode);
		} else {
			struct archive_string_conv* utf8_conv;

			symname[symsize] = '\0';

			/* Symbolic links are embedded as UTF-8 strings */
			utf8_conv = archive_string_conversion_from_charset(&a->archive,
			    "UTF-8", 1);
			if (utf8_conv == NULL) {
				free(symname);
				return ARCHIVE_FATAL;
			}

			archive_entry_copy_symlink_l(entry, (const char*)symname, symsize,
			    utf8_conv);
		}
		free(symname);
		archive_entry_set_size(entry, 0);
	}

	/* Set up a more descriptive format name. */
	snprintf(zip->format_name, sizeof(zip->format_name), "7-Zip");
	a->archive.archive_format_name = zip->format_name;

	return (ret);
}